

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mir-gen.c
# Opt level: O0

int push_to_rename(gen_ctx_t gen_ctx,ssa_edge_t_conflict ssa_edge)

{
  ssa_edge_t_conflict ssa_edge_local;
  gen_ctx_t gen_ctx_local;
  
  if (ssa_edge->flag == '\0') {
    VARR_ssa_edge_tpush(gen_ctx->ssa_ctx->ssa_edges_to_process,ssa_edge);
    ssa_edge->flag = '\x01';
    if ((gen_ctx->debug_file != (FILE *)0x0) && (1 < gen_ctx->debug_level)) {
      fprintf((FILE *)gen_ctx->debug_file,"     Adding ssa edge: def %lu:%d -> use %lu:%d:\n      ",
              (ulong)ssa_edge->def->index,(ulong)ssa_edge->def_op_num,(ulong)ssa_edge->use->index,
              (ulong)ssa_edge->use_op_num);
      print_bb_insn(gen_ctx,ssa_edge->def,0);
      fprintf((FILE *)gen_ctx->debug_file,"     ");
      print_bb_insn(gen_ctx,ssa_edge->use,0);
    }
    gen_ctx_local._4_4_ = 1;
  }
  else {
    gen_ctx_local._4_4_ = 0;
  }
  return gen_ctx_local._4_4_;
}

Assistant:

static int push_to_rename (gen_ctx_t gen_ctx, ssa_edge_t ssa_edge) {
  if (ssa_edge->flag) return FALSE;
  VARR_PUSH (ssa_edge_t, ssa_edges_to_process, ssa_edge);
  ssa_edge->flag = TRUE;
  DEBUG (2, {
    fprintf (debug_file, "     Adding ssa edge: def %lu:%d -> use %lu:%d:\n      ",
             (unsigned long) ssa_edge->def->index, ssa_edge->def_op_num,
             (unsigned long) ssa_edge->use->index, ssa_edge->use_op_num);
    print_bb_insn (gen_ctx, ssa_edge->def, FALSE);
    fprintf (debug_file, "     ");
    print_bb_insn (gen_ctx, ssa_edge->use, FALSE);
  });
  return TRUE;
}